

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O1

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatTest_::
ParseMessageSetWithDeepRecReverseOrder<proto2_unittest::TestAllTypes>::TestBody
          (ParseMessageSetWithDeepRecReverseOrder<proto2_unittest::TestAllTypes> *this)

{
  uint8_t *puVar1;
  EpsCopyOutputStream *pEVar2;
  bool bVar3;
  MessageLite *pMVar4;
  _func_int **pp_Var5;
  uint8_t *ptr;
  pointer *__ptr;
  Arena *arena;
  char *in_R9;
  int i;
  int iVar6;
  TestMessageSet *this_00;
  string_view data_00;
  void *data_1;
  int size;
  StringOutputStream output_stream;
  string data;
  TestMessageSet message_set_1;
  TestMessageSet message_set;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f0;
  AssertHelper local_e8;
  undefined1 local_e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  string local_d0;
  TestMessageSet local_b0;
  CodedOutputStream local_80;
  
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  iVar6 = 0;
  this_00 = &local_b0;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  proto2_wireformat_unittest::TestMessageSet::TestMessageSet(this_00,(Arena *)0x0);
  do {
    pMVar4 = ExtensionSet::MutableMessage
                       (&(this_00->field_0)._impl_._extensions_,
                        proto2_unittest::TestMessageSetExtension1::message_set_extension,'\v',
                        (MessageLite *)proto2_unittest::_TestMessageSetExtension1_default_instance_,
                        (FieldDescriptor *)0x0);
    *(int *)&pMVar4[2]._internal_metadata_.ptr_ = iVar6;
    *(byte *)&pMVar4[1]._vptr_MessageLite = *(byte *)&pMVar4[1]._vptr_MessageLite | 6;
    if (pMVar4[2]._vptr_MessageLite == (_func_int **)0x0) {
      arena = (Arena *)(pMVar4->_internal_metadata_).ptr_;
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
      }
      pp_Var5 = (_func_int **)
                Arena::DefaultConstruct<proto2_wireformat_unittest::TestMessageSet>(arena);
      pMVar4[2]._vptr_MessageLite = pp_Var5;
    }
    this_00 = (TestMessageSet *)pMVar4[2]._vptr_MessageLite;
    iVar6 = iVar6 + 1;
  } while (iVar6 != 200);
  proto2_wireformat_unittest::TestMessageSet::ByteSizeLong(&local_b0);
  io::StringOutputStream::StringOutputStream((StringOutputStream *)local_e0,&local_d0);
  local_80.impl_.is_serialization_deterministic_ =
       (bool)(io::CodedOutputStream::default_serialization_deterministic_ & 1);
  puVar1 = local_80.impl_.buffer_;
  local_80.impl_.had_error_ = false;
  local_80.impl_.aliasing_enabled_ = false;
  local_80.impl_.skip_check_consistency = false;
  local_80.impl_.end_ = puVar1;
  local_80.impl_.buffer_end_ = puVar1;
  local_80.impl_.stream_ = (ZeroCopyOutputStream *)local_e0;
  local_80.cur_ = puVar1;
  local_80.start_count_ = io::StringOutputStream::ByteCount((StringOutputStream *)local_e0);
  bVar3 = io::StringOutputStream::Next
                    ((StringOutputStream *)local_e0,&local_f0._M_head_impl,(int *)&local_e8);
  if (bVar3 && 0 < (int)(uint)local_e8.data_) {
    pEVar2 = (EpsCopyOutputStream *)(local_f0._M_head_impl + -0x10);
    if ((int)(uint)local_e8.data_ < 0x11) {
      pEVar2 = (EpsCopyOutputStream *)puVar1;
    }
    local_80.impl_.end_ = pEVar2->buffer_ + ((ulong)(uint)local_e8.data_ - 0x10);
    local_80.impl_.buffer_end_ = (uint8_t *)local_f0._M_head_impl;
    local_80.cur_ = puVar1;
    if (0x10 < (int)(uint)local_e8.data_) {
      local_80.impl_.buffer_end_ =
           (uint8_t *)(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
      local_80.cur_ = (uint8_t *)local_f0._M_head_impl;
    }
  }
  WireFormatTest<proto2_unittest::TestAllTypes>::SerializeReverseOrder
            (&this->super_WireFormatTest<proto2_unittest::TestAllTypes>,&local_b0,&local_80);
  io::CodedOutputStream::~CodedOutputStream(&local_80);
  proto2_wireformat_unittest::TestMessageSet::~TestMessageSet(&local_b0);
  proto2_wireformat_unittest::TestMessageSet::TestMessageSet
            ((TestMessageSet *)&local_80,(Arena *)0x0);
  data_00._M_str = local_d0._M_dataplus._M_p;
  data_00._M_len = local_d0._M_string_length;
  bVar3 = MessageLite::ParseFromString((MessageLite *)&local_80,data_00);
  local_e0[0] = (internal)!bVar3;
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_b0,(internal *)local_e0,
               (AssertionResult *)"message_set.ParseFromString(data)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x315,(char *)local_b0.super_Message.super_MessageLite._vptr_MessageLite);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if ((anon_union_32_1_493b367e_for_TestMessageSet_3 *)
        local_b0.super_Message.super_MessageLite._vptr_MessageLite != &local_b0.field_0) {
      operator_delete(local_b0.super_Message.super_MessageLite._vptr_MessageLite,
                      (ulong)((long)&((local_b0.field_0._impl_._extensions_.arena_)->impl_).
                                     tag_and_id_ + 1));
    }
    if (local_f0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f0._M_head_impl + 8))();
    }
  }
  if (local_d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d8,local_d8);
  }
  proto2_wireformat_unittest::TestMessageSet::~TestMessageSet((TestMessageSet *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TYPED_TEST_P(WireFormatTest, ParseMessageSetWithDeepRecReverseOrder) {
  std::string data;
  {
    typename TestFixture::TestMessageSet message_set;
    typename TestFixture::TestMessageSet* mset = &message_set;
    for (int i = 0; i < 200; i++) {
      auto m = mset->MutableExtension(
          TestFixture::TestMessageSetExtension1::message_set_extension);
      m->set_i(i);
      mset = m->mutable_recursive();
    }
    message_set.ByteSizeLong();
    // Serialize with reverse payload tag order
    io::StringOutputStream output_stream(&data);
    io::CodedOutputStream coded_output(&output_stream);
    this->SerializeReverseOrder(message_set, &coded_output);
  }
  typename TestFixture::TestMessageSet message_set;
  EXPECT_FALSE(message_set.ParseFromString(data));
}